

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_opengl.c
# Opt level: O1

void update_enabled_arrays(void)

{
  uint8 uVar1;
  ulong uVar2;
  GLint GVar3;
  ulong uVar4;
  
  if (ctx->max_attrs < 1) {
    GVar3 = 0;
  }
  else {
    uVar2 = 0;
    uVar4 = 0;
    do {
      uVar1 = ctx->want_attr[uVar2];
      if (uVar1 != ctx->have_attr[uVar2]) {
        (*(&ctx->glDisableVertexAttribArray)[uVar1 != '\0'])((GLuint)uVar2);
        ctx->have_attr[uVar2] = uVar1;
      }
      uVar2 = uVar2 + 1;
      if (uVar1 != '\0') {
        uVar4 = uVar2 & 0xffffffff;
      }
      GVar3 = (GLint)uVar4;
    } while ((long)uVar2 < (long)ctx->max_attrs);
  }
  ctx->max_attrs = GVar3;
  return;
}

Assistant:

static void update_enabled_arrays(void)
{
    int highest_enabled = 0;
    int i;

    // Enable/disable vertex arrays to match our needs.
    // this happens to work in both ARB1 and GLSL, but if something alien
    //  shows up, we'll have to split these into profile*() functions.
    for (i = 0; i < ctx->max_attrs; i++)
    {
        const int want = (const int) ctx->want_attr[i];
        const int have = (const int) ctx->have_attr[i];
        if (want != have)
        {
            if (want)
                ctx->glEnableVertexAttribArray(i);
            else
                ctx->glDisableVertexAttribArray(i);
            ctx->have_attr[i] = want;
        } // if

        if (want)
            highest_enabled = i + 1;
    } // for

    ctx->max_attrs = highest_enabled;  // trim unneeded iterations next time.
}